

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O3

int8_t msocket_start_io(msocket_t *self)

{
  int8_t iVar1;
  int *piVar2;
  
  if (self == (msocket_t *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    if (self->handlerTable != (msocket_handler_t *)0x0) {
      iVar1 = msocket_startIoThread(self);
      return iVar1;
    }
    piVar2 = __errno_location();
    *piVar2 = 0xe;
  }
  return -1;
}

Assistant:

int8_t msocket_start_io(msocket_t *self){
   if(self != 0) {
      if (self->handlerTable == 0) {
         //Cannot start I/O thread without first setting up handler table
         errno = EFAULT;
         return -1;
      }
      return (int8_t) msocket_startIoThread(self);
   }
   errno=EINVAL;
   return -1;
}